

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O1

void __thiscall Liby::UdpSocket::handleWritEvent(UdpSocket *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Elt_pointer puVar1;
  Buffer *this_01;
  element_type *peVar2;
  _Head_base<0UL,_std::function<void_()>_*,_false> _Var3;
  char *__buf;
  size_t __n;
  ssize_t sVar4;
  off_t oVar5;
  value_type *first;
  uint uVar6;
  UdpSocket *local_78;
  undefined8 uStack_70;
  code *local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  this_00 = (this->self_).super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  uStack_70 = 0;
  local_68 = (code *)0x0;
  uStack_60 = 0;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpSocket.cpp:64:17)>
             ::_M_invoke;
  local_58._8_8_ = 0;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpSocket.cpp:64:17)>
             ::_M_manager;
  local_78 = this;
  local_58._M_unused._M_object = this;
  DeferCaller::~DeferCaller((DeferCaller *)&local_58);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  do {
    puVar1 = (this->writTasks_).
             super__Deque_base<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    if ((this->writTasks_).super__Deque_base<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur == puVar1) break;
    this_01 = (puVar1->buffer_).super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar2 = (this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    __buf = Buffer::data(this_01);
    __n = Buffer::size(this_01);
    sVar4 = sendto(peVar2->fd_,__buf,__n,0,(sockaddr *)puVar1->dest_,0x10);
    uVar6 = (uint)sVar4;
    if ((int)uVar6 < 0) {
      handleErroEvent(this);
    }
    else {
      Buffer::retrieve(this_01,(ulong)(uVar6 & 0x7fffffff));
      oVar5 = Buffer::size(this_01);
      if (oVar5 == 0) {
        _Var3._M_head_impl =
             (puVar1->handler_)._M_t.
             super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>
             .super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl;
        if (((_Any_data *)_Var3._M_head_impl != (_Any_data *)0x0) &&
           (*(long *)&((_Var3._M_head_impl)->super__Function_base)._M_manager != 0)) {
          (*(_Var3._M_head_impl)->_M_invoker)((_Any_data *)_Var3._M_head_impl);
        }
        std::deque<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>::pop_front
                  (&this->writTasks_);
      }
    }
  } while (-1 < (int)uVar6);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void UdpSocket::handleWritEvent() {
    auto self = self_;
    DeferCaller([this] {
        if (destroy_)
            return;
        if (writTasks_.empty())
            enableWrit(false);
    });

    while (!writTasks_.empty()) {
        auto &first = writTasks_.front();
        auto &buffer = *(first.buffer_);

        int n = socket_->sendto(buffer.data(), buffer.size(), 0,
                                (struct sockaddr *)first.dest_,
                                sizeof(struct sockaddr_in));

        if (n < 0) {
            if (n != EAGAIN) {
                handleErroEvent();
            }
            break;
        }

        buffer.retrieve(n);
        if (buffer.size() == 0) {
            if (first.handler_ && *(first.handler_))
                (*first.handler_)();
            writTasks_.pop_front();
        }
    }
}